

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  size_t itime;
  long lVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  undefined1 auVar77 [16];
  float fVar81;
  undefined1 auVar78 [16];
  float fVar82;
  undefined1 auVar79 [16];
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  float fVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  Vec3fa n0;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  Vec3ff v3;
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  Vec3fa n1;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar100 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  size_t local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  ulong local_100;
  anon_class_16_2_07cfa4d6 local_f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  local_148._8_4_ = 0x7f800000;
  local_148._0_8_ = 0x7f8000007f800000;
  local_148._12_4_ = 0x7f800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  local_158._8_4_ = 0xff800000;
  local_158._0_8_ = 0xff800000ff800000;
  local_158._12_4_ = 0xff800000;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar24._8_8_ = 0;
  auVar24._0_4_ =
       (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar24._4_4_ =
       (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar35._8_8_ = 0;
  auVar35._0_4_ = time_range->lower;
  auVar35._4_4_ = time_range->upper;
  uVar21 = vcmpps_avx512vl(auVar24,auVar35,1);
  auVar23 = vinsertps_avx(auVar35,auVar24,0x50);
  auVar24 = vinsertps_avx(auVar24,auVar35,0x50);
  bVar7 = (bool)((byte)uVar21 & 1);
  auVar22._0_4_ = (float)((uint)bVar7 * auVar23._0_4_ | (uint)!bVar7 * auVar24._0_4_);
  bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
  auVar22._4_4_ = (uint)bVar7 * auVar23._4_4_ | (uint)!bVar7 * auVar24._4_4_;
  bVar7 = (bool)((byte)(uVar21 >> 2) & 1);
  auVar22._8_4_ = (uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * auVar24._8_4_;
  bVar7 = (bool)((byte)(uVar21 >> 3) & 1);
  auVar22._12_4_ = (uint)bVar7 * auVar23._12_4_ | (uint)!bVar7 * auVar24._12_4_;
  auVar23 = vmovshdup_avx(auVar22);
  fVar70 = auVar23._0_4_;
  if (auVar22._0_4_ <= fVar70) {
    uVar21 = r->_begin;
    if (uVar21 < r->_end) {
      local_1c8 = 0;
      auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar23 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      auVar100 = ZEXT1664(auVar23);
      auVar98 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar23 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
      auVar99 = ZEXT1664(auVar23);
      local_178._8_4_ = 0x7f800000;
      local_178._0_8_ = 0x7f8000007f800000;
      local_178._12_4_ = 0x7f800000;
      local_148._8_4_ = 0x7f800000;
      local_148._0_8_ = 0x7f8000007f800000;
      local_148._12_4_ = 0x7f800000;
      local_168._8_4_ = 0xff800000;
      local_168._0_8_ = 0xff800000ff800000;
      local_168._12_4_ = 0xff800000;
      local_158._8_4_ = 0xff800000;
      local_158._0_8_ = 0xff800000ff800000;
      local_158._12_4_ = 0xff800000;
      local_180 = k;
      do {
        auVar35 = auVar69._0_16_;
        BVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar31._8_8_ = 0;
        auVar31._0_4_ = BVar1.lower;
        auVar31._4_4_ = BVar1.upper;
        auVar23 = vmovshdup_avx(auVar31);
        fVar53 = BVar1.lower;
        fVar10 = auVar23._0_4_ - fVar53;
        auVar23._0_4_ = (auVar22._0_4_ - fVar53) / fVar10;
        auVar23._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar23 = vmulss_avx512f(auVar23,SUB6416(ZEXT464(0x3f800002),0));
        auVar24 = vmulss_avx512f(ZEXT416((uint)((fVar70 - fVar53) / fVar10)),
                                 SUB6416(ZEXT464(0x3f7ffffc),0));
        uVar2 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                    super_CurveGeometry.super_Geometry.field_0x58 +
                         *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.field_0x68 * uVar21);
        uVar13 = (ulong)(uVar2 + 3);
        pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 vertices.items;
        if (uVar13 < (pBVar3->super_RawBufferView).num) {
          fVar10 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar23 = ZEXT416((uint)(fVar10 * auVar23._0_4_));
          auVar23 = vroundss_avx(auVar23,auVar23,9);
          auVar23 = vmaxss_avx(auVar35,auVar23);
          auVar24 = ZEXT416((uint)(fVar10 * auVar24._0_4_));
          auVar24 = vroundss_avx(auVar24,auVar24,10);
          auVar24 = vminss_avx(auVar24,ZEXT416((uint)fVar10));
          if ((uint)(int)auVar23._0_4_ <= (uint)(int)auVar24._0_4_) {
            uVar17 = (ulong)(int)auVar23._0_4_;
            pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                     super_CurveGeometry.normals.items;
            fVar53 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                     super_CurveGeometry.maxRadiusScale;
            lVar18 = uVar17 * 0x38 + 0x10;
            auVar43 = bezier_basis0._3944_32_;
            do {
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              lVar5 = *(long *)((long)pBVar3 + lVar18 + -0x10);
              lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar18);
              lVar20 = lVar6 * (ulong)uVar2;
              auVar23 = vandps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar20)),auVar30);
              if (1.844e+18 <= auVar23._0_4_) {
LAB_01f08365:
                auVar69 = ZEXT1664(ZEXT816(0) << 0x40);
                goto LAB_01f0869b;
              }
              lVar16 = lVar6 * (ulong)(uVar2 + 1);
              auVar23 = vandps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar16)),auVar30);
              if (1.844e+18 <= auVar23._0_4_) goto LAB_01f08365;
              lVar19 = lVar6 * (ulong)(uVar2 + 2);
              auVar23 = vandps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar19)),auVar30);
              if (1.844e+18 <= auVar23._0_4_) goto LAB_01f08365;
              auVar23 = vandps_avx(ZEXT416(*(uint *)(lVar5 + 0xc + lVar6 * uVar13)),auVar30);
              if (1.844e+18 <= auVar23._0_4_) goto LAB_01f08365;
              auVar23 = *(undefined1 (*) [16])(lVar5 + lVar20);
              auVar35 = auVar98._0_16_;
              uVar12 = vcmpps_avx512vl(auVar23,auVar35,6);
              auVar31 = auVar99._0_16_;
              uVar11 = vcmpps_avx512vl(auVar23,auVar31,1);
              if ((~((ushort)uVar12 & (ushort)uVar11) & 7) != 0) goto LAB_01f08365;
              auVar30 = *(undefined1 (*) [16])(lVar5 + lVar16);
              uVar12 = vcmpps_avx512vl(auVar30,auVar35,6);
              uVar11 = vcmpps_avx512vl(auVar30,auVar31,1);
              if ((~((ushort)uVar12 & (ushort)uVar11) & 7) != 0) goto LAB_01f08365;
              auVar32 = *(undefined1 (*) [16])(lVar5 + lVar19);
              uVar12 = vcmpps_avx512vl(auVar32,auVar35,6);
              uVar11 = vcmpps_avx512vl(auVar32,auVar31,1);
              if ((~((ushort)uVar12 & (ushort)uVar11) & 7) != 0) goto LAB_01f08365;
              auVar25 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar13);
              uVar12 = vcmpps_avx512vl(auVar25,auVar35,6);
              uVar11 = vcmpps_avx512vl(auVar25,auVar31,1);
              if ((~((ushort)uVar12 & (ushort)uVar11) & 7) != 0) goto LAB_01f08365;
              lVar5 = *(long *)((long)pBVar4 + lVar18 + -0x10);
              lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar18);
              auVar33 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar2);
              uVar12 = vcmpps_avx512vl(auVar33,auVar35,6);
              uVar11 = vcmpps_avx512vl(auVar33,auVar31,1);
              if ((~((ushort)uVar12 & (ushort)uVar11) & 7) != 0) goto LAB_01f08365;
              auVar34 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)(uVar2 + 1));
              uVar12 = vcmpps_avx512vl(auVar34,auVar35,6);
              uVar11 = vcmpps_avx512vl(auVar34,auVar31,1);
              if ((~((ushort)uVar12 & (ushort)uVar11) & 7) != 0) goto LAB_01f08365;
              auVar35 = vshufps_avx(auVar23,auVar23,0xff);
              auVar31 = vinsertps_avx(auVar23,ZEXT416((uint)(auVar35._0_4_ * fVar53)),0x30);
              auVar23 = vshufps_avx(auVar30,auVar30,0xff);
              auVar73 = vinsertps_avx512f(auVar30,ZEXT416((uint)(auVar23._0_4_ * fVar53)),0x30);
              auVar23 = vshufps_avx(auVar32,auVar32,0xff);
              auVar32 = vinsertps_avx512f(auVar32,ZEXT416((uint)(auVar23._0_4_ * fVar53)),0x30);
              auVar23 = vshufps_avx(auVar25,auVar25,0xff);
              auVar30 = vinsertps_avx(auVar25,ZEXT416((uint)(auVar23._0_4_ * fVar53)),0x30);
              auVar23 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)(uVar2 + 2));
              auVar40._16_16_ = auVar43._16_16_;
              auVar35 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar13);
              auVar61._8_4_ = 0x80000000;
              auVar61._0_8_ = 0x8000000080000000;
              auVar61._12_4_ = 0x80000000;
              auVar92._0_4_ = auVar30._0_4_ * -0.0;
              auVar92._4_4_ = auVar30._4_4_ * -0.0;
              auVar92._8_4_ = auVar30._8_4_ * -0.0;
              auVar92._12_4_ = auVar30._12_4_ * -0.0;
              auVar25 = vfmadd213ps_avx512vl(ZEXT816(0),auVar32,auVar92);
              auVar25 = vaddps_avx512vl(auVar73,auVar25);
              auVar25 = vfmadd231ps_fma(auVar25,auVar31,auVar61);
              auVar26 = vmulps_avx512vl(auVar30,auVar100._0_16_);
              auVar65._8_4_ = 0x3f000000;
              auVar65._0_8_ = 0x3f0000003f000000;
              auVar65._12_4_ = 0x3f000000;
              auVar26 = vfmadd231ps_avx512vl(auVar26,auVar32,auVar65);
              auVar26 = vfmadd231ps_avx512vl(auVar26,auVar73,auVar100._0_16_);
              auVar84 = vfnmadd231ps_fma(auVar26,auVar31,auVar65);
              auVar27 = vmulps_avx512vl(auVar35,auVar61);
              auVar26 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
              auVar26 = vfmadd213ps_avx512vl(auVar26,auVar23,auVar27);
              auVar26 = vaddps_avx512vl(auVar34,auVar26);
              auVar28 = vfmadd231ps_avx512vl(auVar26,auVar33,auVar61);
              auVar56._0_12_ = ZEXT812(0);
              auVar56._12_4_ = 0;
              auVar26 = vmulps_avx512vl(auVar35,auVar56);
              auVar26 = vfmadd231ps_avx512vl(auVar26,auVar23,auVar65);
              auVar26 = vfmadd231ps_avx512vl(auVar26,auVar34,auVar56);
              auVar29 = vfnmadd231ps_avx512vl(auVar26,auVar33,auVar65);
              auVar26 = vaddps_avx512vl(auVar32,auVar92);
              auVar26 = vfmadd231ps_avx512vl(auVar26,auVar73,auVar56);
              auVar26 = vfmadd231ps_fma(auVar26,auVar31,auVar61);
              auVar93._0_4_ = auVar30._0_4_ * 0.5;
              auVar93._4_4_ = auVar30._4_4_ * 0.5;
              auVar93._8_4_ = auVar30._8_4_ * 0.5;
              auVar93._12_4_ = auVar30._12_4_ * 0.5;
              auVar30 = vfmadd231ps_avx512vl(auVar93,auVar56,auVar32);
              auVar30 = vfnmadd231ps_avx512vl(auVar30,auVar65,auVar73);
              auVar73 = vfmadd231ps_fma(auVar30,auVar56,auVar31);
              auVar31 = vaddps_avx512vl(auVar23,auVar27);
              auVar31 = vfmadd231ps_avx512vl(auVar31,auVar34,auVar56);
              auVar32 = vfmadd231ps_avx512vl(auVar31,auVar33,auVar61);
              auVar35 = vmulps_avx512vl(auVar35,auVar65);
              auVar23 = vfmadd231ps_avx512vl(auVar35,auVar56,auVar23);
              auVar23 = vfnmadd231ps_avx512vl(auVar23,auVar65,auVar34);
              auVar35 = vfmadd231ps_avx512vl(auVar23,auVar56,auVar33);
              auVar23 = vshufps_avx(auVar84,auVar84,0xc9);
              auVar31 = vshufps_avx512vl(auVar28,auVar28,0xc9);
              fVar82 = auVar84._0_4_;
              auVar95._0_4_ = fVar82 * auVar31._0_4_;
              fVar87 = auVar84._4_4_;
              auVar95._4_4_ = fVar87 * auVar31._4_4_;
              fVar88 = auVar84._8_4_;
              auVar95._8_4_ = fVar88 * auVar31._8_4_;
              fVar89 = auVar84._12_4_;
              auVar95._12_4_ = fVar89 * auVar31._12_4_;
              auVar31 = vfmsub231ps_avx512vl(auVar95,auVar23,auVar28);
              auVar31 = vshufps_avx(auVar31,auVar31,0xc9);
              auVar30 = vshufps_avx512vl(auVar29,auVar29,0xc9);
              auVar96._0_4_ = fVar82 * auVar30._0_4_;
              auVar96._4_4_ = fVar87 * auVar30._4_4_;
              auVar96._8_4_ = fVar88 * auVar30._8_4_;
              auVar96._12_4_ = fVar89 * auVar30._12_4_;
              auVar23 = vfmsub231ps_avx512vl(auVar96,auVar23,auVar29);
              auVar40._0_16_ = vxorps_avx512vl(auVar29,auVar29);
              auVar100 = ZEXT1664(auVar40._0_16_);
              auVar30 = vshufps_avx(auVar23,auVar23,0xc9);
              auVar23 = vshufps_avx(auVar73,auVar73,0xc9);
              auVar33 = vshufps_avx512vl(auVar32,auVar32,0xc9);
              auVar90._0_4_ = auVar73._0_4_ * auVar33._0_4_;
              auVar90._4_4_ = auVar73._4_4_ * auVar33._4_4_;
              auVar90._8_4_ = auVar73._8_4_ * auVar33._8_4_;
              auVar90._12_4_ = auVar73._12_4_ * auVar33._12_4_;
              auVar32 = vfmsub231ps_avx512vl(auVar90,auVar23,auVar32);
              auVar32 = vshufps_avx(auVar32,auVar32,0xc9);
              auVar33 = vshufps_avx512vl(auVar35,auVar35,0xc9);
              auVar33 = vmulps_avx512vl(auVar73,auVar33);
              auVar23 = vfmsub231ps_avx512vl(auVar33,auVar23,auVar35);
              auVar33 = vshufps_avx512vl(auVar23,auVar23,0xc9);
              auVar23 = vdpps_avx(auVar31,auVar31,0x7f);
              auVar39._4_28_ = auVar40._4_28_;
              auVar39._0_4_ = auVar23._0_4_;
              auVar35 = vrsqrt14ss_avx512f(auVar40._0_16_,auVar39._0_16_);
              auVar34 = vmulss_avx512f(auVar35,SUB6416(ZEXT464(0x3fc00000),0));
              auVar27 = vmulss_avx512f(auVar23,ZEXT416(0xbf000000));
              auVar27 = vmulss_avx512f(auVar27,auVar35);
              auVar35 = vmulss_avx512f(auVar35,auVar35);
              auVar35 = vmulss_avx512f(auVar27,auVar35);
              auVar34 = vaddss_avx512f(auVar34,auVar35);
              auVar35 = vdpps_avx(auVar31,auVar30,0x7f);
              auVar34 = vbroadcastss_avx512vl(auVar34);
              auVar27 = vmulps_avx512vl(auVar31,auVar34);
              auVar28 = vbroadcastss_avx512vl(auVar23);
              auVar30 = vmulps_avx512vl(auVar28,auVar30);
              fVar55 = auVar35._0_4_;
              auVar29._0_4_ = auVar31._0_4_ * fVar55;
              auVar29._4_4_ = auVar31._4_4_ * fVar55;
              auVar29._8_4_ = auVar31._8_4_ * fVar55;
              auVar29._12_4_ = auVar31._12_4_ * fVar55;
              auVar35 = vsubps_avx(auVar30,auVar29);
              auVar31 = vrcp14ss_avx512f(auVar40._0_16_,auVar39._0_16_);
              auVar23 = vfnmadd213ss_avx512f(auVar23,auVar31,ZEXT416(0x40000000));
              fVar55 = auVar31._0_4_ * auVar23._0_4_;
              auVar28._0_4_ = fVar55 * auVar35._0_4_;
              auVar28._4_4_ = fVar55 * auVar35._4_4_;
              auVar28._8_4_ = fVar55 * auVar35._8_4_;
              auVar28._12_4_ = fVar55 * auVar35._12_4_;
              auVar34 = vmulps_avx512vl(auVar34,auVar28);
              auVar23 = vdpps_avx(auVar32,auVar32,0x7f);
              auVar38._16_16_ = auVar40._16_16_;
              auVar38._0_16_ = auVar40._0_16_;
              auVar36._4_28_ = auVar38._4_28_;
              auVar36._0_4_ = auVar23._0_4_;
              auVar35 = vrsqrt14ss_avx512f(auVar40._0_16_,auVar36._0_16_);
              auVar31 = vmulss_avx512f(auVar35,SUB6416(ZEXT464(0x3fc00000),0));
              auVar30 = vmulss_avx512f(auVar23,ZEXT416(0xbf000000));
              auVar30 = vmulss_avx512f(auVar30,auVar35);
              auVar35 = vmulss_avx512f(auVar30,ZEXT416((uint)(auVar35._0_4_ * auVar35._0_4_)));
              auVar35 = vaddss_avx512f(auVar31,auVar35);
              auVar97._0_4_ = auVar35._0_4_;
              auVar97._4_4_ = auVar97._0_4_;
              auVar97._8_4_ = auVar97._0_4_;
              auVar97._12_4_ = auVar97._0_4_;
              auVar35 = vdpps_avx(auVar32,auVar33,0x7f);
              auVar28 = vmulps_avx512vl(auVar32,auVar97);
              auVar31 = vbroadcastss_avx512vl(auVar23);
              auVar31 = vmulps_avx512vl(auVar31,auVar33);
              fVar55 = auVar35._0_4_;
              auVar33._0_4_ = auVar32._0_4_ * fVar55;
              auVar33._4_4_ = auVar32._4_4_ * fVar55;
              auVar33._8_4_ = auVar32._8_4_ * fVar55;
              auVar33._12_4_ = auVar32._12_4_ * fVar55;
              auVar31 = vsubps_avx(auVar31,auVar33);
              auVar35 = vrcp14ss_avx512f(auVar40._0_16_,auVar36._0_16_);
              auVar23 = vfnmadd213ss_avx512f(auVar23,auVar35,ZEXT416(0x40000000));
              fVar55 = auVar35._0_4_ * auVar23._0_4_;
              auVar23 = vshufps_avx(auVar25,auVar25,0xff);
              auVar33 = vmulps_avx512vl(auVar23,auVar27);
              auVar30 = vsubps_avx(auVar25,auVar33);
              auVar35 = vshufps_avx(auVar84,auVar84,0xff);
              auVar35 = vmulps_avx512vl(auVar35,auVar27);
              auVar27._0_4_ = auVar35._0_4_ + auVar23._0_4_ * auVar34._0_4_;
              auVar27._4_4_ = auVar35._4_4_ + auVar23._4_4_ * auVar34._4_4_;
              auVar27._8_4_ = auVar35._8_4_ + auVar23._8_4_ * auVar34._8_4_;
              auVar27._12_4_ = auVar35._12_4_ + auVar23._12_4_ * auVar34._12_4_;
              auVar32 = vsubps_avx(auVar84,auVar27);
              fVar54 = auVar25._0_4_ + auVar33._0_4_;
              fVar64 = auVar25._4_4_ + auVar33._4_4_;
              fVar80 = auVar25._8_4_ + auVar33._8_4_;
              fVar81 = auVar25._12_4_ + auVar33._12_4_;
              auVar91._0_4_ = fVar82 + auVar27._0_4_;
              auVar91._4_4_ = fVar87 + auVar27._4_4_;
              auVar91._8_4_ = fVar88 + auVar27._8_4_;
              auVar91._12_4_ = fVar89 + auVar27._12_4_;
              auVar23 = vshufps_avx(auVar26,auVar26,0xff);
              auVar33 = vmulps_avx512vl(auVar23,auVar28);
              auVar25 = vsubps_avx(auVar26,auVar33);
              auVar35 = vshufps_avx(auVar73,auVar73,0xff);
              auVar35 = vmulps_avx512vl(auVar35,auVar28);
              auVar34._0_4_ = auVar35._0_4_ + auVar23._0_4_ * auVar97._0_4_ * auVar31._0_4_ * fVar55
              ;
              auVar34._4_4_ = auVar35._4_4_ + auVar23._4_4_ * auVar97._0_4_ * auVar31._4_4_ * fVar55
              ;
              auVar34._8_4_ = auVar35._8_4_ + auVar23._8_4_ * auVar97._0_4_ * auVar31._8_4_ * fVar55
              ;
              auVar34._12_4_ =
                   auVar35._12_4_ + auVar23._12_4_ * auVar97._0_4_ * auVar31._12_4_ * fVar55;
              auVar23 = vsubps_avx(auVar73,auVar34);
              auVar84._0_4_ = auVar26._0_4_ + auVar33._0_4_;
              auVar84._4_4_ = auVar26._4_4_ + auVar33._4_4_;
              auVar84._8_4_ = auVar26._8_4_ + auVar33._8_4_;
              auVar84._12_4_ = auVar26._12_4_ + auVar33._12_4_;
              auVar26._0_4_ = auVar73._0_4_ + auVar34._0_4_;
              auVar26._4_4_ = auVar73._4_4_ + auVar34._4_4_;
              auVar26._8_4_ = auVar73._8_4_ + auVar34._8_4_;
              auVar26._12_4_ = auVar73._12_4_ + auVar34._12_4_;
              auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
              auVar31 = vmulps_avx512vl(auVar32,auVar35);
              fVar55 = auVar30._0_4_;
              auVar32._0_4_ = fVar55 + auVar31._0_4_;
              auVar32._4_4_ = auVar30._4_4_ + auVar31._4_4_;
              auVar32._8_4_ = auVar30._8_4_ + auVar31._8_4_;
              auVar32._12_4_ = auVar30._12_4_ + auVar31._12_4_;
              auVar23 = vmulps_avx512vl(auVar23,auVar35);
              auVar23 = vsubps_avx(auVar25,auVar23);
              auVar68._4_4_ = fVar55;
              auVar68._0_4_ = fVar55;
              auVar68._8_4_ = fVar55;
              auVar68._12_4_ = fVar55;
              auVar68._16_4_ = fVar55;
              auVar68._20_4_ = fVar55;
              auVar68._24_4_ = fVar55;
              auVar68._28_4_ = fVar55;
              auVar36 = vbroadcastss_avx512vl(ZEXT416(1));
              auVar37 = vpermps_avx512vl(auVar36,ZEXT1632(auVar30));
              auVar38 = vbroadcastss_avx512vl(ZEXT416(2));
              auVar39 = vpermps_avx512vl(auVar38,ZEXT1632(auVar30));
              auVar40 = vbroadcastss_avx512vl(auVar32);
              auVar41 = vpermps_avx512vl(auVar36,ZEXT1632(auVar32));
              auVar42 = vpermps_avx512vl(auVar38,ZEXT1632(auVar32));
              auVar43 = vbroadcastss_avx512vl(auVar23);
              auVar44 = vpermps_avx512vl(auVar36,ZEXT1632(auVar23));
              auVar45 = vpermps_avx512vl(auVar38,ZEXT1632(auVar23));
              auVar46 = vbroadcastss_avx512vl(auVar25);
              auVar47 = vpermps_avx512vl(auVar36,ZEXT1632(auVar25));
              auVar48 = vpermps_avx512vl(auVar38,ZEXT1632(auVar25));
              auVar49 = vmulps_avx512vl(auVar46,bezier_basis0._3944_32_);
              auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._2788_32_,auVar43);
              auVar46 = vmulps_avx512vl(auVar46,bezier_basis0._8568_32_);
              auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._7412_32_,auVar43);
              auVar43 = vmulps_avx512vl(auVar47,bezier_basis0._3944_32_);
              auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._2788_32_,auVar44);
              auVar47 = vmulps_avx512vl(auVar47,bezier_basis0._8568_32_);
              auVar44 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._7412_32_,auVar44);
              auVar47 = vmulps_avx512vl(auVar48,bezier_basis0._3944_32_);
              auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._2788_32_,auVar45);
              auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._1632_32_,auVar40);
              auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._1632_32_,auVar41);
              auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._1632_32_,auVar42);
              auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._476_32_,auVar68);
              auVar50 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._476_32_,auVar37);
              auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._476_32_,auVar39);
              auVar43._4_4_ = auVar48._4_4_ * bezier_basis0._8572_4_;
              auVar43._0_4_ = auVar48._0_4_ * bezier_basis0._8568_4_;
              auVar43._8_4_ = auVar48._8_4_ * bezier_basis0._8576_4_;
              auVar43._12_4_ = auVar48._12_4_ * bezier_basis0._8580_4_;
              auVar43._16_4_ = auVar48._16_4_ * bezier_basis0._8584_4_;
              auVar43._20_4_ = auVar48._20_4_ * bezier_basis0._8588_4_;
              auVar43._24_4_ = auVar48._24_4_ * bezier_basis0._8592_4_;
              auVar43._28_4_ = auVar48._28_4_;
              auVar23 = vfmadd231ps_fma(auVar43,bezier_basis0._7412_32_,auVar45);
              auVar43 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._6256_32_,auVar40);
              auVar40 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._6256_32_,auVar41);
              auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),bezier_basis0._6256_32_,auVar42);
              auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._5100_32_,auVar68);
              auVar37 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._5100_32_,auVar37);
              auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),bezier_basis0._5100_32_,auVar39);
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
              auVar42 = vmulps_avx512vl(auVar43,auVar41);
              auVar44 = vmulps_avx512vl(auVar37,auVar41);
              auVar45 = vmulps_avx512vl(ZEXT1632(auVar23),auVar41);
              auVar25 = ZEXT816(0) << 0x40;
              auVar43 = vblendps_avx(auVar42,ZEXT1632(auVar25),1);
              auVar37 = vblendps_avx(auVar44,ZEXT1632(auVar25),1);
              auVar51 = ZEXT1632(auVar25);
              auVar39 = vblendps_avx(auVar45,auVar51,1);
              auVar40 = vsubps_avx(auVar49,auVar43);
              auVar46 = vsubps_avx512vl(auVar50,auVar37);
              auVar48 = vsubps_avx512vl(auVar47,auVar39);
              auVar43 = vblendps_avx(auVar42,auVar51,0x80);
              auVar37 = vblendps_avx(auVar44,auVar51,0x80);
              auVar39 = vblendps_avx(auVar45,auVar51,0x80);
              auVar52._0_4_ = auVar49._0_4_ + auVar43._0_4_;
              auVar52._4_4_ = auVar49._4_4_ + auVar43._4_4_;
              auVar52._8_4_ = auVar49._8_4_ + auVar43._8_4_;
              auVar52._12_4_ = auVar49._12_4_ + auVar43._12_4_;
              auVar52._16_4_ = auVar49._16_4_ + auVar43._16_4_;
              auVar52._20_4_ = auVar49._20_4_ + auVar43._20_4_;
              auVar52._24_4_ = auVar49._24_4_ + auVar43._24_4_;
              auVar52._28_4_ = auVar49._28_4_ + auVar43._28_4_;
              auVar37 = vaddps_avx512vl(auVar50,auVar37);
              auVar39 = vaddps_avx512vl(auVar47,auVar39);
              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar43 = vminps_avx512vl(auVar42,auVar49);
              auVar44 = vminps_avx512vl(auVar42,auVar50);
              auVar45 = vminps_avx512vl(auVar42,auVar47);
              auVar51 = vminps_avx512vl(auVar40,auVar52);
              auVar51 = vminps_avx512vl(auVar43,auVar51);
              auVar43 = vminps_avx512vl(auVar46,auVar37);
              auVar44 = vminps_avx512vl(auVar44,auVar43);
              auVar43 = vminps_avx512vl(auVar48,auVar39);
              auVar45 = vminps_avx512vl(auVar45,auVar43);
              auVar43 = vmaxps_avx(auVar40,auVar52);
              auVar30 = vmulps_avx512vl(auVar91,auVar35);
              fVar55 = fVar54 + auVar30._0_4_;
              auVar23 = vmulps_avx512vl(auVar26,auVar35);
              auVar32 = vsubps_avx512vl(auVar84,auVar23);
              in_ZMM21 = ZEXT1664(auVar32);
              auVar52 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar40 = vmaxps_avx512vl(auVar52,auVar49);
              auVar49 = vmaxps_avx512vl(auVar52,auVar50);
              auVar47 = vmaxps_avx512vl(auVar52,auVar47);
              auVar43 = vmaxps_avx(auVar40,auVar43);
              auVar37 = vmaxps_avx(auVar46,auVar37);
              auVar37 = vmaxps_avx(auVar49,auVar37);
              auVar39 = vmaxps_avx(auVar48,auVar39);
              auVar39 = vmaxps_avx(auVar47,auVar39);
              auVar40 = vshufps_avx512vl(auVar51,auVar51,0xb1);
              auVar46 = vminps_avx512vl(auVar51,auVar40);
              auVar40 = vshufpd_avx(auVar46,auVar46,5);
              auVar40 = vminps_avx(auVar46,auVar40);
              auVar23 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
              auVar40 = vshufps_avx512vl(auVar44,auVar44,0xb1);
              auVar44 = vminps_avx512vl(auVar44,auVar40);
              auVar40 = vshufpd_avx(auVar44,auVar44,5);
              auVar40 = vminps_avx(auVar44,auVar40);
              auVar35 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
              auVar35 = vunpcklps_avx(auVar23,auVar35);
              auVar40 = vshufps_avx512vl(auVar45,auVar45,0xb1);
              auVar44 = vminps_avx512vl(auVar45,auVar40);
              auVar40 = vshufpd_avx(auVar44,auVar44,5);
              auVar40 = vminps_avx(auVar44,auVar40);
              auVar23 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
              auVar23 = vinsertps_avx(auVar35,auVar23,0x28);
              auVar40 = vshufps_avx(auVar43,auVar43,0xb1);
              auVar43 = vmaxps_avx(auVar43,auVar40);
              auVar40 = vshufpd_avx(auVar43,auVar43,5);
              auVar43 = vmaxps_avx(auVar43,auVar40);
              auVar35 = vmaxps_avx(auVar43._0_16_,auVar43._16_16_);
              auVar43 = vshufps_avx(auVar37,auVar37,0xb1);
              auVar43 = vmaxps_avx(auVar37,auVar43);
              auVar37 = vshufpd_avx(auVar43,auVar43,5);
              auVar43 = vmaxps_avx(auVar43,auVar37);
              auVar31 = vmaxps_avx(auVar43._0_16_,auVar43._16_16_);
              auVar31 = vunpcklps_avx(auVar35,auVar31);
              auVar43 = vshufps_avx(auVar39,auVar39,0xb1);
              auVar43 = vmaxps_avx(auVar39,auVar43);
              auVar37 = vshufpd_avx(auVar43,auVar43,5);
              auVar43 = vmaxps_avx(auVar43,auVar37);
              auVar35 = vmaxps_avx(auVar43._0_16_,auVar43._16_16_);
              auVar35 = vinsertps_avx(auVar31,auVar35,0x28);
              auVar50._4_4_ = fVar54;
              auVar50._0_4_ = fVar54;
              auVar50._8_4_ = fVar54;
              auVar50._12_4_ = fVar54;
              auVar50._16_4_ = fVar54;
              auVar50._20_4_ = fVar54;
              auVar50._24_4_ = fVar54;
              auVar50._28_4_ = fVar54;
              auVar37 = ZEXT1632(CONCAT412(fVar81,CONCAT48(fVar80,CONCAT44(fVar64,fVar54))));
              auVar43 = vpermps_avx512vl(auVar36,auVar37);
              auVar39 = vpermps_avx512vl(auVar38,auVar37);
              auVar94._4_4_ = fVar55;
              auVar94._0_4_ = fVar55;
              auVar94._8_4_ = fVar55;
              auVar94._12_4_ = fVar55;
              auVar94._16_4_ = fVar55;
              auVar94._20_4_ = fVar55;
              auVar94._24_4_ = fVar55;
              auVar94._28_4_ = fVar55;
              auVar37 = ZEXT1632(CONCAT412(fVar81 + auVar30._12_4_,
                                           CONCAT48(fVar80 + auVar30._8_4_,
                                                    CONCAT44(fVar64 + auVar30._4_4_,fVar55))));
              auVar40 = vpermps_avx512vl(auVar36,auVar37);
              auVar44 = vpermps_avx512vl(auVar38,auVar37);
              auVar37 = vbroadcastss_avx512vl(auVar32);
              auVar45 = vpermps_avx512vl(auVar36,ZEXT1632(auVar32));
              auVar46 = vpermps_avx512vl(auVar38,ZEXT1632(auVar32));
              auVar47 = vbroadcastss_avx512vl(auVar84);
              auVar36 = vpermps_avx512vl(auVar36,ZEXT1632(auVar84));
              auVar38 = vpermps_avx512vl(auVar38,ZEXT1632(auVar84));
              auVar48 = vmulps_avx512vl(auVar47,bezier_basis0._3944_32_);
              auVar48 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._2788_32_,auVar37);
              auVar47 = vmulps_avx512vl(auVar47,bezier_basis0._8568_32_);
              auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._7412_32_,auVar37);
              auVar37 = vmulps_avx512vl(auVar36,bezier_basis0._3944_32_);
              auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._2788_32_,auVar45);
              auVar36 = vmulps_avx512vl(auVar36,bezier_basis0._8568_32_);
              auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._7412_32_,auVar45);
              auVar45 = vmulps_avx512vl(auVar38,bezier_basis0._3944_32_);
              auVar45 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._2788_32_,auVar46);
              auVar48 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._1632_32_,auVar94);
              auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._1632_32_,auVar40);
              auVar45 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._1632_32_,auVar44);
              auVar48 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._476_32_,auVar50);
              auVar49 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._476_32_,auVar43);
              auVar45 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._476_32_,auVar39);
              auVar37._4_4_ = auVar38._4_4_ * bezier_basis0._8572_4_;
              auVar37._0_4_ = auVar38._0_4_ * bezier_basis0._8568_4_;
              auVar37._8_4_ = auVar38._8_4_ * bezier_basis0._8576_4_;
              auVar37._12_4_ = auVar38._12_4_ * bezier_basis0._8580_4_;
              auVar37._16_4_ = auVar38._16_4_ * bezier_basis0._8584_4_;
              auVar37._20_4_ = auVar38._20_4_ * bezier_basis0._8588_4_;
              auVar37._24_4_ = auVar38._24_4_ * bezier_basis0._8592_4_;
              auVar37._28_4_ = auVar38._28_4_;
              auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._7412_32_,auVar46);
              auVar38 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._6256_32_,auVar94);
              auVar40 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._6256_32_,auVar40);
              auVar31 = vfmadd231ps_fma(auVar37,bezier_basis0._6256_32_,auVar44);
              auVar37 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._5100_32_,auVar50);
              auVar43 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._5100_32_,auVar43);
              auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),bezier_basis0._5100_32_,auVar39);
              auVar38 = vmulps_avx512vl(auVar37,auVar41);
              auVar44 = vmulps_avx512vl(auVar43,auVar41);
              auVar41 = vmulps_avx512vl(ZEXT1632(auVar31),auVar41);
              auVar47 = ZEXT1632(auVar25);
              auVar43 = vblendps_avx(auVar38,auVar47,1);
              auVar37 = vblendps_avx(auVar44,auVar47,1);
              auVar39 = vblendps_avx(auVar41,auVar47,1);
              auVar40 = vsubps_avx(auVar48,auVar43);
              auVar36 = vsubps_avx(auVar49,auVar37);
              auVar46 = vsubps_avx512vl(auVar45,auVar39);
              auVar43 = vblendps_avx(auVar38,auVar47,0x80);
              auVar37 = vblendps_avx(auVar44,auVar47,0x80);
              auVar39 = vblendps_avx(auVar41,auVar47,0x80);
              auVar47._0_4_ = auVar48._0_4_ + auVar43._0_4_;
              auVar47._4_4_ = auVar48._4_4_ + auVar43._4_4_;
              auVar47._8_4_ = auVar48._8_4_ + auVar43._8_4_;
              auVar47._12_4_ = auVar48._12_4_ + auVar43._12_4_;
              auVar47._16_4_ = auVar48._16_4_ + auVar43._16_4_;
              auVar47._20_4_ = auVar48._20_4_ + auVar43._20_4_;
              auVar47._24_4_ = auVar48._24_4_ + auVar43._24_4_;
              auVar47._28_4_ = auVar48._28_4_ + auVar43._28_4_;
              auVar51._0_4_ = auVar49._0_4_ + auVar37._0_4_;
              auVar51._4_4_ = auVar49._4_4_ + auVar37._4_4_;
              auVar51._8_4_ = auVar49._8_4_ + auVar37._8_4_;
              auVar51._12_4_ = auVar49._12_4_ + auVar37._12_4_;
              auVar51._16_4_ = auVar49._16_4_ + auVar37._16_4_;
              auVar51._20_4_ = auVar49._20_4_ + auVar37._20_4_;
              auVar51._24_4_ = auVar49._24_4_ + auVar37._24_4_;
              auVar51._28_4_ = auVar49._28_4_ + auVar37._28_4_;
              auVar38 = vaddps_avx512vl(auVar45,auVar39);
              auVar43 = vminps_avx512vl(auVar42,auVar48);
              auVar37 = vminps_avx512vl(auVar42,auVar49);
              auVar39 = vminps_avx512vl(auVar42,auVar45);
              auVar41 = vminps_avx512vl(auVar40,auVar47);
              auVar41 = vminps_avx512vl(auVar43,auVar41);
              auVar43 = vminps_avx512vl(auVar36,auVar51);
              auVar42 = vminps_avx512vl(auVar37,auVar43);
              auVar43 = vminps_avx512vl(auVar46,auVar38);
              auVar44 = vminps_avx512vl(auVar39,auVar43);
              auVar43 = vmaxps_avx(auVar40,auVar47);
              auVar37 = vmaxps_avx512vl(auVar52,auVar48);
              auVar37 = vmaxps_avx(auVar37,auVar43);
              auVar43 = vmaxps_avx(auVar36,auVar51);
              auVar39 = vmaxps_avx512vl(auVar52,auVar49);
              auVar25._8_4_ = 0xddccb9a2;
              auVar25._0_8_ = 0xddccb9a2ddccb9a2;
              auVar25._12_4_ = 0xddccb9a2;
              auVar98 = ZEXT1664(auVar25);
              auVar39 = vmaxps_avx(auVar39,auVar43);
              auVar43 = vmaxps_avx(auVar46,auVar38);
              auVar40 = vmaxps_avx512vl(auVar52,auVar45);
              auVar32 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
              auVar99 = ZEXT1664(auVar32);
              auVar40 = vmaxps_avx(auVar40,auVar43);
              auVar43 = vshufps_avx(auVar41,auVar41,0xb1);
              auVar43 = vminps_avx(auVar41,auVar43);
              auVar36 = vshufpd_avx(auVar43,auVar43,5);
              auVar43 = vminps_avx(auVar43,auVar36);
              auVar31 = vminps_avx(auVar43._0_16_,auVar43._16_16_);
              auVar43 = vshufps_avx512vl(auVar42,auVar42,0xb1);
              auVar36 = vminps_avx512vl(auVar42,auVar43);
              auVar43 = vshufpd_avx(auVar36,auVar36,5);
              auVar43 = vminps_avx(auVar36,auVar43);
              auVar30 = vminps_avx(auVar43._0_16_,auVar43._16_16_);
              auVar30 = vunpcklps_avx(auVar31,auVar30);
              auVar43 = vshufps_avx512vl(auVar44,auVar44,0xb1);
              auVar43 = vminps_avx512vl(auVar44,auVar43);
              auVar36 = vshufpd_avx(auVar43,auVar43,5);
              auVar36 = vminps_avx(auVar43,auVar36);
              auVar31 = vminps_avx(auVar36._0_16_,auVar36._16_16_);
              auVar31 = vinsertps_avx(auVar30,auVar31,0x28);
              auVar30 = vminps_avx(auVar23,auVar31);
              auVar36 = vshufps_avx(auVar37,auVar37,0xb1);
              auVar37 = vmaxps_avx(auVar37,auVar36);
              auVar36 = vshufpd_avx(auVar37,auVar37,5);
              auVar37 = vmaxps_avx(auVar37,auVar36);
              auVar23 = vmaxps_avx(auVar37._0_16_,auVar37._16_16_);
              auVar37 = vshufps_avx(auVar39,auVar39,0xb1);
              auVar37 = vmaxps_avx(auVar39,auVar37);
              auVar39 = vshufpd_avx(auVar37,auVar37,5);
              auVar37 = vmaxps_avx(auVar37,auVar39);
              auVar31 = vmaxps_avx(auVar37._0_16_,auVar37._16_16_);
              auVar31 = vunpcklps_avx(auVar23,auVar31);
              auVar37 = vshufps_avx(auVar40,auVar40,0xb1);
              auVar37 = vmaxps_avx(auVar40,auVar37);
              auVar39 = vshufpd_avx(auVar37,auVar37,5);
              auVar37 = vmaxps_avx(auVar37,auVar39);
              auVar23 = vmaxps_avx(auVar37._0_16_,auVar37._16_16_);
              auVar23 = vinsertps_avx(auVar31,auVar23,0x28);
              auVar23 = vmaxps_avx(auVar35,auVar23);
              uVar12 = vcmpps_avx512vl(auVar23,auVar32,1);
              uVar11 = vcmpps_avx512vl(auVar30,auVar25,6);
              if ((~((ushort)uVar12 & (ushort)uVar11) & 7) != 0) goto LAB_01f08365;
              uVar17 = uVar17 + 1;
              lVar18 = lVar18 + 0x38;
            } while (uVar17 <= (ulong)(long)(int)auVar24._0_4_);
            auVar31._8_8_ = 0;
            auVar31._0_4_ =
                 (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.lower;
            auVar31._4_4_ =
                 (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.upper;
            auVar35 = ZEXT416(0) << 0x40;
          }
          local_f8.primID = &local_100;
          auVar23 = vmovshdup_avx(auVar31);
          fVar53 = auVar31._0_4_;
          fVar54 = auVar23._0_4_ - fVar53;
          fVar64 = (auVar22._0_4_ - fVar53) / fVar54;
          fVar54 = (fVar70 - fVar53) / fVar54;
          fVar53 = fVar10 * fVar64;
          fVar55 = fVar10 * fVar54;
          auVar31 = vroundss_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53),9);
          auVar30 = vroundss_avx(ZEXT416((uint)fVar55),ZEXT416((uint)fVar55),10);
          auVar23 = vmaxss_avx(auVar31,auVar35);
          auVar24 = vminss_avx(auVar30,ZEXT416((uint)fVar10));
          iVar15 = (int)auVar23._0_4_;
          fVar80 = auVar24._0_4_;
          uVar2 = (int)auVar31._0_4_;
          if ((int)auVar31._0_4_ < 0) {
            uVar2 = 0xffffffff;
          }
          iVar14 = (int)fVar10 + 1;
          if ((int)auVar30._0_4_ < (int)fVar10 + 1) {
            iVar14 = (int)auVar30._0_4_;
          }
          local_100 = uVar21;
          local_f8.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_c8.field_1,&local_f8,(long)iVar15);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_f8,(long)(int)fVar80);
          fVar53 = fVar53 - auVar23._0_4_;
          if (iVar14 - uVar2 == 1) {
            auVar23 = vmaxss_avx(ZEXT416((uint)fVar53),ZEXT816(0) << 0x40);
            fVar53 = auVar23._0_4_;
            fVar10 = 1.0 - fVar53;
            auVar71._0_4_ = fVar53 * local_e8.m128[0];
            auVar71._4_4_ = fVar53 * local_e8.m128[1];
            auVar71._8_4_ = fVar53 * local_e8.m128[2];
            auVar71._12_4_ = fVar53 * local_e8.m128[3];
            auVar59._4_4_ = fVar10;
            auVar59._0_4_ = fVar10;
            auVar59._8_4_ = fVar10;
            auVar59._12_4_ = fVar10;
            auVar73 = vfmadd231ps_fma(auVar71,auVar59,(undefined1  [16])local_c8);
            auVar74._0_4_ = fVar53 * local_d8._0_4_;
            auVar74._4_4_ = fVar53 * local_d8._4_4_;
            auVar74._8_4_ = fVar53 * local_d8._8_4_;
            auVar74._12_4_ = fVar53 * local_d8._12_4_;
            auVar76 = vfmadd231ps_fma(auVar74,local_b8,auVar59);
            auVar23 = vmaxss_avx(ZEXT416((uint)(fVar80 - fVar55)),ZEXT816(0) << 0x40);
            fVar53 = auVar23._0_4_;
            fVar10 = 1.0 - fVar53;
            auVar77._0_4_ = fVar53 * local_c8.m128[0];
            auVar77._4_4_ = fVar53 * local_c8.m128[1];
            auVar77._8_4_ = fVar53 * local_c8.m128[2];
            auVar77._12_4_ = fVar53 * local_c8.m128[3];
            auVar60._4_4_ = fVar10;
            auVar60._0_4_ = fVar10;
            auVar60._8_4_ = fVar10;
            auVar60._12_4_ = fVar10;
            auVar79 = vfmadd231ps_fma(auVar77,auVar60,(undefined1  [16])local_e8);
            auVar83._0_4_ = fVar53 * local_b8._0_4_;
            auVar83._4_4_ = fVar53 * local_b8._4_4_;
            auVar83._8_4_ = fVar53 * local_b8._8_4_;
            auVar83._12_4_ = fVar53 * local_b8._12_4_;
            auVar86 = vfmadd231ps_fma(auVar83,auVar60,local_d8);
            auVar23 = ZEXT816(0);
            auVar24 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
            auVar100 = ZEXT1664(auVar24);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_f8,(long)(iVar15 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_f8,(long)((int)fVar80 + -1));
            auVar23 = vmaxss_avx(ZEXT416((uint)fVar53),ZEXT816(0) << 0x40);
            fVar81 = auVar23._0_4_;
            auVar72._0_4_ = fVar81 * local_58.m128[0];
            auVar72._4_4_ = fVar81 * local_58.m128[1];
            auVar72._8_4_ = fVar81 * local_58.m128[2];
            auVar72._12_4_ = fVar81 * local_58.m128[3];
            fVar53 = 1.0 - fVar81;
            auVar57._4_4_ = fVar53;
            auVar57._0_4_ = fVar53;
            auVar57._8_4_ = fVar53;
            auVar57._12_4_ = fVar53;
            auVar73 = vfmadd231ps_fma(auVar72,auVar57,(undefined1  [16])local_c8);
            auVar75._0_4_ = fVar81 * local_48;
            auVar75._4_4_ = fVar81 * fStack_44;
            auVar75._8_4_ = fVar81 * fStack_40;
            auVar75._12_4_ = fVar81 * fStack_3c;
            auVar76 = vfmadd231ps_fma(auVar75,auVar57,local_b8);
            auVar23 = vmaxss_avx(ZEXT416((uint)(fVar80 - fVar55)),ZEXT816(0) << 0x40);
            fVar55 = auVar23._0_4_;
            fVar53 = 1.0 - fVar55;
            auVar78._0_4_ = fVar55 * local_78.m128[0];
            auVar78._4_4_ = fVar55 * local_78.m128[1];
            auVar78._8_4_ = fVar55 * local_78.m128[2];
            auVar78._12_4_ = fVar55 * local_78.m128[3];
            auVar62._4_4_ = fVar53;
            auVar62._0_4_ = fVar53;
            auVar62._8_4_ = fVar53;
            auVar62._12_4_ = fVar53;
            auVar79 = vfmadd231ps_fma(auVar78,auVar62,(undefined1  [16])local_e8);
            auVar85._0_4_ = fVar55 * local_68;
            auVar85._4_4_ = fVar55 * fStack_64;
            auVar85._8_4_ = fVar55 * fStack_60;
            auVar85._12_4_ = fVar55 * fStack_5c;
            auVar86 = vfmadd231ps_fma(auVar85,auVar62,local_d8);
            if ((int)(uVar2 + 1) < iVar14) {
              itime = (size_t)(uVar2 + 1);
              iVar14 = ~uVar2 + iVar14;
              do {
                auVar24 = auVar100._0_16_;
                fVar55 = ((float)(int)itime / fVar10 - fVar64) / (fVar54 - fVar64);
                fVar53 = 1.0 - fVar55;
                auVar66._0_4_ = auVar79._0_4_ * fVar55;
                fVar80 = auVar79._4_4_;
                auVar66._4_4_ = fVar80 * fVar55;
                fVar81 = auVar79._8_4_;
                auVar66._8_4_ = fVar81 * fVar55;
                fVar82 = auVar79._12_4_;
                auVar66._12_4_ = fVar82 * fVar55;
                auVar63._4_4_ = fVar53;
                auVar63._0_4_ = fVar53;
                auVar63._8_4_ = fVar53;
                auVar63._12_4_ = fVar53;
                auVar23 = vfmadd231ps_fma(auVar66,auVar63,auVar73);
                auVar58._0_4_ = auVar86._0_4_ * fVar55;
                fVar53 = auVar86._4_4_;
                auVar58._4_4_ = fVar53 * fVar55;
                fVar87 = auVar86._8_4_;
                auVar58._8_4_ = fVar87 * fVar55;
                fVar88 = auVar86._12_4_;
                auVar58._12_4_ = fVar88 * fVar55;
                local_a8 = vfmadd231ps_fma(auVar58,auVar76,auVar63);
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_f8,itime);
                local_1b8 = auVar76._0_4_;
                fStack_1b4 = auVar76._4_4_;
                fStack_1b0 = auVar76._8_4_;
                fStack_1ac = auVar76._12_4_;
                local_1a8 = auVar73._0_4_;
                fStack_1a4 = auVar73._4_4_;
                fStack_1a0 = auVar73._8_4_;
                fStack_19c = auVar73._12_4_;
                auVar35 = vxorps_avx512vl(auVar24,auVar24);
                auVar100 = ZEXT1664(auVar35);
                auVar23 = vsubps_avx((undefined1  [16])local_98,auVar23);
                auVar24 = vsubps_avx(local_88,local_a8);
                auVar23 = vminps_avx512vl(auVar23,auVar35);
                auVar24 = vmaxps_avx512vl(auVar24,auVar35);
                auVar73._0_4_ = local_1a8 + auVar23._0_4_;
                auVar73._4_4_ = fStack_1a4 + auVar23._4_4_;
                auVar73._8_4_ = fStack_1a0 + auVar23._8_4_;
                auVar73._12_4_ = fStack_19c + auVar23._12_4_;
                auVar79._0_4_ = auVar79._0_4_ + auVar23._0_4_;
                auVar79._4_4_ = fVar80 + auVar23._4_4_;
                auVar79._8_4_ = fVar81 + auVar23._8_4_;
                auVar79._12_4_ = fVar82 + auVar23._12_4_;
                auVar76._0_4_ = local_1b8 + auVar24._0_4_;
                auVar76._4_4_ = fStack_1b4 + auVar24._4_4_;
                auVar76._8_4_ = fStack_1b0 + auVar24._8_4_;
                auVar76._12_4_ = fStack_1ac + auVar24._12_4_;
                auVar86._0_4_ = auVar86._0_4_ + auVar24._0_4_;
                auVar86._4_4_ = fVar53 + auVar24._4_4_;
                auVar86._8_4_ = fVar87 + auVar24._8_4_;
                auVar86._12_4_ = fVar88 + auVar24._12_4_;
                itime = itime + 1;
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
            }
            else {
              auVar23 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
              auVar100 = ZEXT1664(auVar23);
            }
            auVar23 = ZEXT816(0) << 0x20;
          }
          auVar69 = ZEXT1664(auVar23 << 0x20);
          uVar12 = vcmpps_avx512vl(auVar73,auVar76,2);
          auVar98 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar23 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
          auVar99 = ZEXT1664(auVar23);
          if (((~(ushort)uVar12 & 7) == 0) &&
             (uVar12 = vcmpps_avx512vl(auVar79,auVar86,2), (~(ushort)uVar12 & 7) == 0)) {
            auVar23 = vminps_avx(auVar73,auVar79);
            aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar23,ZEXT416(geomID),0x30);
            auVar23 = vmaxps_avx(auVar76,auVar86);
            aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar23,ZEXT416((uint)uVar21),0x30);
            auVar67._0_4_ = aVar8.x + aVar9.x;
            auVar67._4_4_ = aVar8.y + aVar9.y;
            auVar67._8_4_ = aVar8.z + aVar9.z;
            auVar67._12_4_ = aVar8.field_3.w + aVar9.field_3.w;
            local_178 = vminps_avx(local_178,(undefined1  [16])aVar8);
            local_168 = vmaxps_avx(local_168,(undefined1  [16])aVar9);
            local_148 = vminps_avx(local_148,auVar67);
            local_158 = vmaxps_avx(local_158,auVar67);
            local_1c8 = local_1c8 + 1;
            prims[local_180].lower.field_0.field_1 = aVar8;
            prims[local_180].upper.field_0.field_1 = aVar9;
            local_180 = local_180 + 1;
          }
        }
LAB_01f0869b:
        uVar21 = uVar21 + 1;
      } while (uVar21 < r->_end);
    }
    else {
      local_1c8 = 0;
      local_168._8_4_ = 0xff800000;
      local_168._0_8_ = 0xff800000ff800000;
      local_168._12_4_ = 0xff800000;
      local_178._8_4_ = 0x7f800000;
      local_178._0_8_ = 0x7f8000007f800000;
      local_178._12_4_ = 0x7f800000;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_148._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_148._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_158._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_158._8_8_;
    __return_storage_ptr__->end = local_1c8;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }